

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

int32_t ucnv_toUCountPending_63(UConverter *cnv,UErrorCode *status)

{
  char cVar1;
  uint uVar2;
  int32_t iVar3;
  uint uVar4;
  
  iVar3 = -1;
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (cnv == (UConverter *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return iVar3;
    }
    cVar1 = cnv->preToULength;
    iVar3 = (int32_t)cVar1;
    if (cVar1 < '\x01') {
      if (-1 < cVar1) {
        uVar2._0_1_ = cnv->toULength;
        uVar2._1_1_ = cnv->toUBytes[0];
        uVar2._2_1_ = cnv->toUBytes[1];
        uVar2._3_1_ = cnv->toUBytes[2];
        uVar4 = 0;
        if ('\0' < (char)(undefined1)uVar2) {
          uVar4 = uVar2;
        }
        return uVar4 & 0xff;
      }
      return -iVar3;
    }
  }
  return iVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_toUCountPending(const UConverter* cnv, UErrorCode* status){

    if(status == NULL || U_FAILURE(*status)){
        return -1;
    }
    if(cnv == NULL){
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    }

    if(cnv->preToULength > 0){
        return cnv->preToULength ;
    }else if(cnv->preToULength < 0){
        return -cnv->preToULength;
    }else if(cnv->toULength > 0){
        return cnv->toULength;
    }
    return 0;
}